

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_PostScript.cxx
# Opt level: O0

void __thiscall Fl_PostScript_Graphics_Driver::push_no_clip(Fl_PostScript_Graphics_Driver *this)

{
  Clip *__s;
  Clip *c;
  Fl_PostScript_Graphics_Driver *this_local;
  
  __s = (Clip *)operator_new(0x18);
  memset(__s,0,0x18);
  __s->prev = this->clip_;
  this->clip_ = __s;
  this->clip_->h = -1;
  this->clip_->w = -1;
  this->clip_->y = -1;
  this->clip_->x = -1;
  fprintf((FILE *)this->output,"CR\nCS\n");
  if (this->lang_level_ < 3) {
    recover(this);
  }
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::push_no_clip() {
  Clip * c = new Clip();
  c->prev=clip_;
  clip_=c;
  clip_->x = clip_->y = clip_->w = clip_->h = -1;
  fprintf(output, "CR\nCS\n");
  if(lang_level_<3)
    recover();
}